

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

void __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t<int>
          (uintwide_t<256U,_unsigned_short,_void,_true> *this,int v,
          enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *p_nullparam)

{
  ushort *puVar1;
  short *psVar2;
  representation_type *prVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  prVar3 = &this->values;
  (prVar3->super_array<unsigned_short,_16UL>).elems[8] = 0;
  (prVar3->super_array<unsigned_short,_16UL>).elems[9] = 0;
  (prVar3->super_array<unsigned_short,_16UL>).elems[10] = 0;
  (prVar3->super_array<unsigned_short,_16UL>).elems[0xb] = 0;
  prVar3 = &this->values;
  (prVar3->super_array<unsigned_short,_16UL>).elems[0xc] = 0;
  (prVar3->super_array<unsigned_short,_16UL>).elems[0xd] = 0;
  (prVar3->super_array<unsigned_short,_16UL>).elems[0xe] = 0;
  (prVar3->super_array<unsigned_short,_16UL>).elems[0xf] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[0] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[1] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[2] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[3] = 0;
  prVar3 = &this->values;
  (prVar3->super_array<unsigned_short,_16UL>).elems[4] = 0;
  (prVar3->super_array<unsigned_short,_16UL>).elems[5] = 0;
  (prVar3->super_array<unsigned_short,_16UL>).elems[6] = 0;
  (prVar3->super_array<unsigned_short,_16UL>).elems[7] = 0;
  if (v < 0) {
    uVar6 = -v;
    local_18 = 0;
    uStack_10 = 0;
    local_28 = 0;
    uStack_20 = 0;
    lVar4 = -0x20;
    do {
      lVar5 = lVar4;
      *(short *)(&stack0xfffffffffffffff8 + lVar5) = (short)uVar6;
      lVar4 = lVar5 + 2;
      if (uVar6 < 0x10000) break;
      uVar6 = uVar6 >> 0x10;
    } while (lVar5 != -2);
    if (lVar4 != 0) {
      memset(&stack0xfffffffffffffffa + lVar5,0,-lVar4);
    }
    *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 8) = local_18;
    *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xc) = uStack_10;
    *(undefined8 *)(this->values).super_array<unsigned_short,_16UL>.elems = local_28;
    *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 4) = uStack_20;
    lVar4 = 0;
    do {
      puVar1 = (ushort *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar4);
      *puVar1 = ~*puVar1;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x20);
    lVar4 = 0;
    do {
      psVar2 = (short *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar4);
      *psVar2 = *psVar2 + 1;
      if (*psVar2 != 0) {
        return;
      }
      bVar7 = lVar4 != 0x1e;
      lVar4 = lVar4 + 2;
    } while (bVar7);
  }
  else {
    local_18 = 0;
    uStack_10 = 0;
    local_28 = 0;
    uStack_20 = 0;
    if (v == 0) {
      lVar4 = 0;
    }
    else {
      lVar5 = 0;
      do {
        *(short *)((long)&local_28 + lVar5) = (short)v;
        lVar4 = lVar5 + 2;
        if ((uint)v < 0x10000) break;
        v = (uint)v >> 0x10;
        bVar7 = lVar5 != 0x1e;
        lVar5 = lVar4;
      } while (bVar7);
    }
    if (lVar4 != 0x20) {
      memset((void *)((long)&local_28 + lVar4),0,0x20 - lVar4);
    }
    *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 8) = local_18;
    *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xc) = uStack_10;
    *(undefined8 *)(this->values).super_array<unsigned_short,_16UL>.elems = local_28;
    *(undefined8 *)((this->values).super_array<unsigned_short,_16UL>.elems + 4) = uStack_20;
  }
  return;
}

Assistant:

constexpr uintwide_t(const SignedIntegralType v, // NOLINT(google-explicit-constructor,hicpp-explicit-conversions)
                         std::enable_if_t<(   std::is_integral<SignedIntegralType>::value
                                           && std::is_signed  <SignedIntegralType>::value)>* p_nullparam = nullptr)
      : values(number_of_limbs)
    {
      static_cast<void>(p_nullparam == nullptr);

      using local_signed_integral_type   = SignedIntegralType;
      using local_unsigned_integral_type =
        typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<local_signed_integral_type>::digits + 1)>::exact_unsigned_type;

      const auto v_is_neg = (v < static_cast<local_signed_integral_type>(0));

      const local_unsigned_integral_type u =
        ((!v_is_neg) ? static_cast<local_unsigned_integral_type>(v)
                     : static_cast<local_unsigned_integral_type>(detail::negate(v)));

      operator=(uintwide_t(u));

      if(v_is_neg) { negate(); }
    }